

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper6
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6)

{
  code *pcVar1;
  anon_class_56_7_d90978dc fn;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  Var arg4_local;
  Var arg3_local;
  Var arg2_local;
  Var arg1_local;
  void *origHelperAddr_local;
  ScriptContext *scriptContext_local;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x7a,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn.arg1 = arg1;
  fn.origHelperAddr = origHelperAddr;
  fn.arg2 = arg2;
  fn.arg3 = arg3;
  fn.arg4 = arg4;
  fn.arg5 = arg5;
  fn.arg6 = arg6;
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper6(Js::ScriptContext*,void*,void*,void*,void*,void*,void*,void*)::__0>
                     (scriptContext,fn);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper6(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod6)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6);
        });
    }